

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

PointerType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetPointer(PointerType *__return_storage_ptr__,
            GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *this,SchemaType *schema)

{
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *rhs;
  
  rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *)(this->schemaMap_).stack_;
  while( true ) {
    if (rhs == (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                *)(this->schemaMap_).stackTop_) {
      __return_storage_ptr__->tokenCount_ = 0;
      __return_storage_ptr__->parseErrorOffset_ = 0;
      __return_storage_ptr__->nameBuffer_ = (Ch *)0x0;
      __return_storage_ptr__->tokens_ = (Token *)0x0;
      __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
      __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
      __return_storage_ptr__->parseErrorCode_ = kPointerParseErrorNone;
      return __return_storage_ptr__;
    }
    if ((SchemaType *)rhs[1].allocator_ == schema) break;
    rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *)&rhs[1].nameBuffer_;
  }
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::GenericPointer(__return_storage_ptr__,rhs);
  return __return_storage_ptr__;
}

Assistant:

PointerType GetPointer(const SchemaType* schema) const {
        for (const SchemaEntry* target = schemaMap_.template Bottom<SchemaEntry>(); target != schemaMap_.template End<SchemaEntry>(); ++target)
            if (schema == target->schema)
                return target->pointer;
        return PointerType();
    }